

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckBox.cpp
# Opt level: O2

shared_ptr<gui::CheckBox> __thiscall
gui::CheckBox::create(CheckBox *this,shared_ptr<gui::CheckBoxStyle> *style,String *name)

{
  CheckBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::CheckBox> sVar1;
  __shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (CheckBox *)operator_new(0x2e8);
  std::__shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>);
  CheckBox(this_00,(shared_ptr<gui::CheckBoxStyle> *)&local_40,name);
  std::__shared_ptr<gui::CheckBox,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::CheckBox,void>
            ((__shared_ptr<gui::CheckBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::CheckBox>)
         sVar1.super___shared_ptr<gui::CheckBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CheckBox> CheckBox::create(std::shared_ptr<CheckBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<CheckBox>(new CheckBox(style, name));
}